

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

_Bool rm(upb_table *t,lookupkey_t key,upb_value *val,uint32_t hash,eqlfunc_t *eql)

{
  _upb_tabent *p_Var1;
  _Bool _Var2;
  upb_key uVar3;
  byte local_81;
  upb_tabent *rm;
  upb_tabent *move;
  upb_tabent *chain;
  eqlfunc_t *eql_local;
  uint32_t hash_local;
  upb_value *val_local;
  upb_table *t_local;
  lookupkey_t key_local;
  
  move = getentry_mutable(t,hash);
  _Var2 = upb_tabent_isempty(move);
  if (_Var2) {
    key_local.str.size._7_1_ = 0;
  }
  else {
    _Var2 = (*eql)(move->key,key);
    if (_Var2) {
      t->count = t->count - 1;
      if (val != (upb_value *)0x0) {
        val->val = (move->val).val;
      }
      if (move->next == (_upb_tabent *)0x0) {
        uVar3 = upb_key_empty();
        move->key = uVar3;
      }
      else {
        p_Var1 = move->next;
        (move->val).val = (p_Var1->val).val;
        move->key = p_Var1->key;
        move->next = p_Var1->next;
        uVar3 = upb_key_empty();
        p_Var1->key = uVar3;
      }
      key_local.str.size._7_1_ = 1;
    }
    else {
      while( true ) {
        local_81 = 0;
        if (move->next != (_upb_tabent *)0x0) {
          _Var2 = (*eql)(move->next->key,key);
          local_81 = _Var2 ^ 0xff;
        }
        if ((local_81 & 1) == 0) break;
        move = move->next;
      }
      if (move->next == (_upb_tabent *)0x0) {
        key_local.str.size._7_1_ = 0;
      }
      else {
        p_Var1 = move->next;
        t->count = t->count - 1;
        if (val != (upb_value *)0x0) {
          val->val = (move->next->val).val;
        }
        uVar3 = upb_key_empty();
        p_Var1->key = uVar3;
        move->next = p_Var1->next;
        key_local.str.size._7_1_ = 1;
      }
    }
  }
  return (_Bool)key_local.str.size._7_1_;
}

Assistant:

static bool rm(upb_table* t, lookupkey_t key, upb_value* val, uint32_t hash,
               eqlfunc_t* eql) {
  upb_tabent* chain = getentry_mutable(t, hash);
  if (upb_tabent_isempty(chain)) return false;
  if (eql(chain->key, key)) {
    /* Element to remove is at the head of its chain. */
    t->count--;
    if (val) *val = chain->val;
    if (chain->next) {
      upb_tabent* move = (upb_tabent*)chain->next;
      *chain = *move;
      move->key = upb_key_empty();
    } else {
      chain->key = upb_key_empty();
    }
    return true;
  } else {
    /* Element to remove is either in a non-head position or not in the
     * table. */
    while (chain->next && !eql(chain->next->key, key)) {
      chain = (upb_tabent*)chain->next;
    }
    if (chain->next) {
      /* Found element to remove. */
      upb_tabent* rm = (upb_tabent*)chain->next;
      t->count--;
      if (val) *val = chain->next->val;
      rm->key = upb_key_empty();
      chain->next = rm->next;
      return true;
    } else {
      /* Element to remove is not in the table. */
      return false;
    }
  }
}